

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySubImage3D.cpp
# Opt level: O1

void __thiscall glcts::TextureCubeMapArraySubImage3D::initTest(TextureCubeMapArraySubImage3D *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  long lVar3;
  
  if ((this->super_TestCaseBase).m_is_texture_cube_map_array_supported != false) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar3 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar3 + 0x6d0))(1,&this->m_read_fbo_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error generating frame buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x5e);
    (**(code **)(lVar3 + 0x78))(0x8ca8,this->m_read_fbo_id);
    dVar2 = (**(code **)(lVar3 + 0x800))();
    glu::checkError(dVar2,"Error binding frame buffer object!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
                    ,0x61);
    return;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Texture cube map array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySubImage3D.cpp"
             ,0x57);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArraySubImage3D::initTest(void)
{
	/* Check if texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genFramebuffers(1, &m_read_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating frame buffer object!");

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_read_fbo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding frame buffer object!");
}